

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O0

void requestPage(string *url)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_180 [32];
  bind_t<void,_void_(*)(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::_bi::list3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  undefined1 local_138 [8];
  query query;
  resolver resolver;
  undefined1 local_70 [8];
  string path;
  string hostname;
  string service;
  string *url_local;
  
  std::__cxx11::string::string((string *)(hostname.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  parseURL(url,(string *)(hostname.field_2._M_local_buf + 8),
           (string *)(path.field_2._M_local_buf + 8),(string *)local_70);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_resolver<boost::asio::io_context>
            ((basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)((long)&query.service_name_.field_2 + 8),&io_service,(type *)0x0);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_138,
             (string *)((long)&path.field_2 + 8),(string *)((long)&hostname.field_2 + 8),
             address_configured);
  std::__cxx11::string::string(local_180,(string *)url);
  boost::
  bind<void,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::__cxx11::string,boost::arg<1>(*)(),boost::arg<2>(*)(),std::__cxx11::string>
            (&local_160,(boost *)resolveHandler,boost::asio::placeholders::error,
             boost::asio::placeholders::iterator,(_func_arg<2> *)local_180,in_R9);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<boost::_bi::bind_t<void,void(*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::__cxx11::string),boost::_bi::list3<boost::arg<1>(*)(),boost::arg<2>(*)(),boost::_bi::value<std::__cxx11::string>>>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)(query.service_name_.field_2._M_local_buf + 8),(query *)local_138,&local_160);
  boost::_bi::
  bind_t<void,_void_(*)(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::_bi::list3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~bind_t(&local_160);
  std::__cxx11::string::~string(local_180);
  boost::asio::io_context::run(&io_service);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_138);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_resolver((basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)((long)&query.service_name_.field_2 + 8));
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(hostname.field_2._M_local_buf + 8));
  return;
}

Assistant:

void requestPage( const string& url ){
    // Split the URL into parts.
    string service, hostname, path;
    parseURL( url, service, hostname, path );

    // Just like tutorial 1, we start by resolving the hostname and service provided from the
    // command line. Only now we will use the asynchronous version which takes a callback function
    // as its second parameter.
    //
    // NOTE I am using the `boost::asio::placeholder`s, however you could use the normal bind
    //      placeholders. If you are using C++11's `std::bind` then you must use `std::placeholder`s
    //      instead as they are not compatible.
    tcp::resolver           resolver( io_service );
    tcp::resolver::query    query( hostname, service );
    resolver.async_resolve(
        query,
        boost::bind(
            &resolveHandler,
            boost::asio::placeholders::error,
            boost::asio::placeholders::iterator,
            url
        )
    );

    // Next we run the IO service. Note that we are doing this _after_ triggering an asynchronous
    // functon. This is very important, if the `io_service` has nothing to run then all threads
    // calling `io_service.run()` will exit. If you would like to control when the `io_service`
    // stops simply create a `boost::asio::io_service::work` object before calling
    // `io_service.run()` and then destroy that object when you are done. Note that you only need
    // one `io_service::work` object per `io_service` object.
    io_service.run();
}